

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::add_hard_pinching(Balk *this,int shift,double segment_length)

{
  shared_ptr<HardPinching> local_40;
  shared_ptr<Term> local_30;
  double local_20;
  double segment_length_local;
  Balk *pBStack_10;
  int shift_local;
  Balk *this_local;
  
  local_20 = segment_length;
  segment_length_local._4_4_ = shift;
  pBStack_10 = this;
  std::make_shared<HardPinching,int&,double&>
            ((int *)&local_40,(double *)((long)&segment_length_local + 4));
  std::shared_ptr<Term>::shared_ptr<HardPinching,void>(&local_30,&local_40);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_30);
  std::shared_ptr<Term>::~shared_ptr(&local_30);
  std::shared_ptr<HardPinching>::~shared_ptr(&local_40);
  return;
}

Assistant:

void Balk::add_hard_pinching(int shift, double segment_length)
{
    terms.push_back(std::make_shared<HardPinching>(shift, segment_length));
}